

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O3

bool active_if_clipboard_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object clipboard;
  Am_Value_List clipboard_value;
  Am_Object local_20;
  Am_Value_List local_18;
  
  local_20.data = (Am_Object_Data *)0x0;
  Am_Value_List::Am_Value_List(&local_18);
  pAVar2 = Am_Object::Get(self,0x19d,0);
  Am_Object::operator=(&local_20,pAVar2);
  bVar1 = Am_Object::Valid(&local_20);
  if (!bVar1) {
    Am_Object::operator=(&local_20,&Am_Global_Clipboard);
  }
  bVar1 = Am_Object::Valid(&local_20);
  if (bVar1) {
    pAVar2 = Am_Object::Get(&local_20,0x169,0);
    Am_Value_List::operator=(&local_18,pAVar2);
    bVar1 = Am_Value_List::Empty(&local_18);
    bVar1 = !bVar1;
  }
  else {
    bVar1 = false;
  }
  Am_Value_List::~Am_Value_List(&local_18);
  Am_Object::~Am_Object(&local_20);
  return bVar1;
}

Assistant:

Am_Define_Formula(bool, active_if_clipboard)
{
  Am_Object clipboard;
  Am_Value_List clipboard_value;
  clipboard = self.Get(Am_CLIPBOARD);
  if (!clipboard.Valid())
    clipboard = Am_Global_Clipboard;
  if (clipboard.Valid()) {
    clipboard_value = clipboard.Get(Am_VALUE);
    return (!clipboard_value.Empty());
  } else
    return false;
}